

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O2

void __thiscall OutputIterations::~OutputIterations(OutputIterations *this)

{
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->iteration_times).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->iterations).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

OutputIterations() = default;